

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcICheck.c
# Opt level: O1

Vec_Int_t *
Bmc_PerformISearch(Gia_Man_t *p,int nFramesMax,int nTimeOut,int fReverse,int fBackTopo,int fDump,
                  int fVerbose)

{
  uint uVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  Vec_Int_t *p_01;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  
  if (fVerbose != 0) {
    pcVar4 = "reverse";
    if (fReverse == 0) {
      pcVar4 = "direct";
    }
    pcVar5 = "backward";
    if (fBackTopo == 0) {
      pcVar5 = "natural";
    }
    printf("Solving M-inductiveness for design %s with %d AND nodes and %d flip-flops with %s %s flop order:\n"
           ,p->pName,(ulong)(uint)(~(p->vCos->nSize + p->vCis->nSize) + p->nObjs),
           (ulong)(uint)p->nRegs,pcVar4,pcVar5);
  }
  fflush(_stdout);
  iVar7 = p->vCos->nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < iVar7 - 1U) {
    iVar9 = iVar7;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar9;
  if (iVar9 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar9 << 2);
  }
  p_00->pArray = piVar2;
  if (0 < p->nRegs) {
    iVar7 = 0;
    iVar9 = 0;
    do {
      Vec_IntPush(p_00,iVar7);
      iVar9 = iVar9 + 1;
      iVar7 = iVar7 + 2;
    } while (iVar9 < p->nRegs);
  }
  if (0 < nFramesMax) {
    iVar7 = 1;
    do {
      iVar9 = Bmc_PerformISearchOne(p,iVar7,nTimeOut,fReverse,fBackTopo,fVerbose,p_00);
      if (iVar9 != 0) {
        piVar2 = p_00->pArray;
        p_01 = (Vec_Int_t *)0x0;
        goto LAB_0053e55c;
      }
      iVar9 = (1 - nFramesMax) + iVar7;
      iVar7 = iVar7 + 1;
    } while (iVar9 != 1);
  }
  if (fDump != 0) {
    if ((long)p->nRegs < 1) {
      uVar6 = 0;
    }
    else {
      uVar3 = 0;
      uVar8 = (ulong)(uint)p_00->nSize;
      if (p_00->nSize < 1) {
        uVar8 = uVar3;
      }
      uVar6 = 0;
      do {
        if (uVar8 == uVar3) goto LAB_0053e588;
        if (p_00->pArray[uVar3] < 0) goto LAB_0053e5a7;
        uVar6 = (ulong)((int)uVar6 + (~p_00->pArray[uVar3] & 1U));
        uVar3 = uVar3 + 1;
      } while ((long)p->nRegs != uVar3);
    }
    printf("The set contains %d (out of %d) next-state functions with 0-based numbers:\n",uVar6);
    if (0 < p->nRegs) {
      uVar1 = p_00->nSize;
      if (p_00->nSize < 1) {
        uVar1 = 0;
      }
      uVar6 = 0;
      do {
        if (uVar1 == uVar6) goto LAB_0053e588;
        if (p_00->pArray[uVar6] < 0) goto LAB_0053e5a7;
        if ((p_00->pArray[uVar6] & 1U) == 0) {
          printf("%d ",uVar6 & 0xffffffff);
        }
        uVar6 = uVar6 + 1;
      } while ((long)uVar6 < (long)p->nRegs);
    }
    putchar(10);
  }
  iVar7 = p->nRegs;
  p_01 = (Vec_Int_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < iVar7 - 1U) {
    iVar9 = iVar7;
  }
  p_01->nSize = 0;
  p_01->nCap = iVar9;
  if (iVar9 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar9 << 2);
  }
  p_01->pArray = piVar2;
  if (0 < p->nRegs) {
    uVar8 = 0;
    uVar6 = (ulong)(uint)p_00->nSize;
    if (p_00->nSize < 1) {
      uVar6 = uVar8;
    }
    do {
      if (uVar6 == uVar8) {
LAB_0053e588:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (p_00->pArray[uVar8] < 0) {
LAB_0053e5a7:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf3,"int Abc_LitIsCompl(int)");
      }
      Vec_IntPush(p_01,~p_00->pArray[uVar8] & 1);
      uVar8 = uVar8 + 1;
    } while ((long)uVar8 < (long)p->nRegs);
  }
  piVar2 = p_00->pArray;
LAB_0053e55c:
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  return p_01;
}

Assistant:

Vec_Int_t * Bmc_PerformISearch( Gia_Man_t * p, int nFramesMax, int nTimeOut, int fReverse, int fBackTopo, int fDump, int fVerbose )
{
    Vec_Int_t * vLits, * vFlops;
    int i, f;
    if ( fVerbose )
    printf( "Solving M-inductiveness for design %s with %d AND nodes and %d flip-flops with %s %s flop order:\n",
        Gia_ManName(p), Gia_ManAndNum(p), Gia_ManRegNum(p), fReverse ? "reverse":"direct", fBackTopo ? "backward":"natural" );
    fflush( stdout );

    // collect positive literals
    vLits = Vec_IntAlloc( Gia_ManCoNum(p) );
    for ( i = 0; i < Gia_ManRegNum(p); i++ )
        Vec_IntPush( vLits, Abc_Var2Lit(i, 0) );

    for ( f = 1; f <= nFramesMax; f++ )
        if ( Bmc_PerformISearchOne( p, f, nTimeOut, fReverse, fBackTopo, fVerbose, vLits ) )
        {
            Vec_IntFree( vLits );
            return NULL;
        }

    // dump the numbers of the flops
    if ( fDump )
    {
        int nLitsUsed = 0;
        for ( i = 0; i < Gia_ManRegNum(p); i++ )
            if ( !Abc_LitIsCompl(Vec_IntEntry(vLits, i)) )
                nLitsUsed++;
        printf( "The set contains %d (out of %d) next-state functions with 0-based numbers:\n", nLitsUsed, Gia_ManRegNum(p) );
        for ( i = 0; i < Gia_ManRegNum(p); i++ )
            if ( !Abc_LitIsCompl(Vec_IntEntry(vLits, i)) )
                printf( "%d ", i );
        printf( "\n" );
    }       
    // save flop indexes
    vFlops = Vec_IntAlloc( Gia_ManRegNum(p) );
    for ( i = 0; i < Gia_ManRegNum(p); i++ )
        if ( !Abc_LitIsCompl(Vec_IntEntry(vLits, i)) )
            Vec_IntPush( vFlops, 1 );
        else
            Vec_IntPush( vFlops, 0 );
    Vec_IntFree( vLits );
    return vFlops;
}